

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

ssize_t base64_encode_using_maps
                  (base64_maps_t *maps,char *dest,size_t destlen,char *src,size_t srclen)

{
  size_t sVar1;
  int *piVar2;
  base64_maps_t *local_48;
  size_t dest_offset;
  size_t src_offset;
  size_t srclen_local;
  char *src_local;
  size_t destlen_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  dest_offset = 0;
  local_48 = (base64_maps_t *)0x0;
  sVar1 = base64_encoded_length(srclen);
  if (destlen < sVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0x4b;
    maps_local = (base64_maps_t *)0xffffffffffffffff;
  }
  else {
    for (; 2 < srclen - dest_offset; dest_offset = dest_offset + 3) {
      base64_encode_triplet_using_maps(maps,dest + (long)local_48,src + dest_offset);
      local_48 = (base64_maps_t *)(local_48->encode_map + 4);
    }
    if (dest_offset < srclen) {
      base64_encode_tail_using_maps
                (maps,dest + (long)local_48,src + dest_offset,srclen - dest_offset);
      local_48 = (base64_maps_t *)(local_48->encode_map + 4);
    }
    memset(dest + (long)local_48,0,destlen - (long)local_48);
    maps_local = local_48;
  }
  return (ssize_t)maps_local;
}

Assistant:

ssize_t base64_encode_using_maps(const base64_maps_t *maps,
				 char *dest, const size_t destlen,
				 const char *src, const size_t srclen)
{
	size_t src_offset = 0;
	size_t dest_offset = 0;

	if (destlen < base64_encoded_length(srclen)) {
		errno = EOVERFLOW;
		return -1;
	}

	while (srclen - src_offset >= 3) {
		base64_encode_triplet_using_maps(maps, &dest[dest_offset], &src[src_offset]);
		src_offset += 3;
		dest_offset += 4;
	}

	if (src_offset < srclen) {
		base64_encode_tail_using_maps(maps, &dest[dest_offset], &src[src_offset], srclen-src_offset);
		dest_offset += 4;
	}

	memset(&dest[dest_offset], '\0', destlen-dest_offset);

	return dest_offset;
}